

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  const_reference p;
  char *pcVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  reference name;
  ulong uVar7;
  ostream *poVar8;
  PolicyID id;
  bool local_ba1;
  allocator<char> local_b19;
  undefined1 local_b18 [8];
  string m;
  string local_af0;
  undefined1 local_ac9;
  char *pcStack_ac8;
  bool readit;
  char *include;
  undefined1 local_aa0 [8];
  string extraInclude;
  allocator<char> local_a59;
  string local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  allocator<char> local_a11;
  string local_a10;
  string local_9f0;
  string local_9d0;
  undefined1 local_9b0 [8];
  ostringstream w;
  char *v_1;
  string *i_2;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string vw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  undefined1 local_750 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv_1;
  string local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  allocator<char> local_6e9;
  string local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  allocator<char> local_659;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  allocator<char> local_611;
  string local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  undefined1 local_5d0 [8];
  string vv;
  int i_1;
  int vc;
  uint v [4];
  char vb [4] [64];
  char *sep;
  string vs;
  undefined1 local_450 [8];
  string e;
  RegularExpression vx;
  string local_358;
  PolicyStatus local_338;
  allocator<char> local_331;
  PolicyStatus cmp0048;
  anon_class_16_2_0515cf3d local_310;
  allocator<char> local_2f9;
  string local_2f8;
  anon_class_16_2_0515cf3d local_2d8;
  allocator<char> local_2c1;
  string local_2c0;
  anon_class_16_2_0515cf3d local_2a0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  allocator<char> local_241;
  undefined1 local_240 [8];
  string msg;
  string local_218;
  ulong local_1f8;
  size_t i;
  anon_class_8_1_0e9793f7 aStack_1e8;
  Doing doing;
  anon_class_8_1_0e9793f7 resetReporter;
  function<void_()> missedValueReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string homepage;
  string description;
  string version;
  undefined1 local_140 [2];
  bool injectedProjectCommand;
  bool haveHomepage;
  bool haveDescription;
  bool haveLanguages;
  bool haveVersion;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string srcdir;
  string bindir;
  string *projectName;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_7_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmProjectCommand *this_local;
  
  local_28 = param_2;
  param_7_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"PROJECT called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_004464b2;
  }
  p = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_7_local,0);
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,p);
  std::__cxx11::string::string((string *)(srcdir.field_2._M_local_buf + 8),(string *)p);
  std::__cxx11::string::operator+=((string *)(srcdir.field_2._M_local_buf + 8),"_BINARY_DIR");
  std::__cxx11::string::string((string *)local_a8,(string *)p);
  std::__cxx11::string::operator+=((string *)local_a8,"_SOURCE_DIR");
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddCacheDefinition
            (pcVar1,(string *)((long)&srcdir.field_2 + 8),pcVar3,"Value Computed by CMake",STATIC,
             false);
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddCacheDefinition
            (pcVar1,(string *)local_a8,pcVar3,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::operator=((string *)(srcdir.field_2._M_local_buf + 8),"PROJECT_BINARY_DIR");
  std::__cxx11::string::operator=((string *)local_a8,"PROJECT_SOURCE_DIR");
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&srcdir.field_2 + 8),pcVar3);
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)local_a8,pcVar3);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"PROJECT_NAME",&local_c9);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_c8,pcVar3);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CMAKE_PROJECT_NAME",&local_f1);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_f0);
  local_ba1 = true;
  if (pcVar3 != (char *)0x0) {
    local_ba1 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  if (local_ba1 != false) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_PROJECT_NAME",&local_119);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&local_118,pcVar3);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_140,"CMAKE_PROJECT_NAME",
               (allocator<char> *)(version.field_2._M_local_buf + 0xf));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              (pcVar1,(string *)local_140,pcVar3,"Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)local_140);
    std::allocator<char>::~allocator((allocator<char> *)(version.field_2._M_local_buf + 0xf));
  }
  version.field_2._M_local_buf[0xe] = '\0';
  version.field_2._M_local_buf[0xd] = '\0';
  version.field_2._M_local_buf[0xc] = '\0';
  version.field_2._M_local_buf[0xb] = '\0';
  version.field_2._M_local_buf[10] = '\0';
  std::__cxx11::string::string((string *)(description.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(homepage.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&missedValueReporter._M_invoker);
  std::function<void_()>::function((function<void_()> *)&resetReporter);
  aStack_1e8.missedValueReporter = (function<void_()> *)&resetReporter;
  i._4_4_ = 2;
  for (local_1f8 = 1; uVar7 = local_1f8,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_7_local), uVar7 < sVar4; local_1f8 = local_1f8 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_7_local,local_1f8);
    bVar2 = std::operator==(pvVar5,"LANGUAGES");
    if (bVar2) {
      if ((version.field_2._M_local_buf[0xd] & 1U) != 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"LANGUAGES may be specified at most once.",
                   (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
        goto LAB_0044640c;
      }
      version.field_2._M_local_buf[0xd] = '\x01';
      bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
      if (bVar2) {
        std::function<void_()>::operator()((function<void_()> *)&resetReporter);
      }
      i._4_4_ = 2;
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_240,
                   "the following parameters must be specified after LANGUAGES keyword: ",&local_241
                  );
        std::allocator<char>::~allocator(&local_241);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_268,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&missedValueReporter._M_invoker,", ");
        std::__cxx11::string::operator+=((string *)local_240,(string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::operator+=((string *)local_240,'.');
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,WARNING,(string *)local_240);
        std::__cxx11::string::~string((string *)local_240);
      }
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_7_local,local_1f8);
      bVar2 = std::operator==(pvVar5,"VERSION");
      if (bVar2) {
        if ((version.field_2._M_local_buf[0xe] & 1U) != 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"VERSION may be specified at most once.",&local_289);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
          cmSystemTools::SetFatalErrorOccured();
          this_local._7_1_ = 1;
          msg.field_2._8_4_ = 1;
          goto LAB_0044640c;
        }
        version.field_2._M_local_buf[0xe] = '\x01';
        bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
        if (bVar2) {
          std::function<void_()>::operator()((function<void_()> *)&resetReporter);
        }
        i._4_4_ = 3;
        local_2a0.resetReporter = &stack0xfffffffffffffe18;
        local_2a0.this = this;
        std::function<void()>::operator=((function<void()> *)&resetReporter,&local_2a0);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_7_local,local_1f8);
        bVar2 = std::operator==(pvVar5,"DESCRIPTION");
        if (bVar2) {
          if ((version.field_2._M_local_buf[0xc] & 1U) != 0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2c0,"DESCRIPTION may be specified at most once.",&local_2c1)
            ;
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2c0);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::allocator<char>::~allocator(&local_2c1);
            cmSystemTools::SetFatalErrorOccured();
            this_local._7_1_ = 1;
            msg.field_2._8_4_ = 1;
            goto LAB_0044640c;
          }
          version.field_2._M_local_buf[0xc] = '\x01';
          bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
          if (bVar2) {
            std::function<void_()>::operator()((function<void_()> *)&resetReporter);
          }
          i._4_4_ = 0;
          local_2d8.resetReporter = &stack0xfffffffffffffe18;
          local_2d8.this = this;
          std::function<void()>::operator=((function<void()> *)&resetReporter,&local_2d8);
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_7_local,local_1f8);
          bVar2 = std::operator==(pvVar5,"HOMEPAGE_URL");
          if (bVar2) {
            if ((version.field_2._M_local_buf[0xb] & 1U) != 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2f8,"HOMEPAGE_URL may be specified at most once.",
                         &local_2f9);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2f8);
              std::__cxx11::string::~string((string *)&local_2f8);
              std::allocator<char>::~allocator(&local_2f9);
              cmSystemTools::SetFatalErrorOccured();
              this_local._7_1_ = 1;
              msg.field_2._8_4_ = 1;
              goto LAB_0044640c;
            }
            version.field_2._M_local_buf[0xb] = '\x01';
            i._4_4_ = 1;
            local_310.resetReporter = &stack0xfffffffffffffe18;
            local_310.this = this;
            std::function<void()>::operator=((function<void()> *)&resetReporter,&local_310);
          }
          else {
            if (local_1f8 == 1) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,1);
              bVar2 = std::operator==(pvVar5,"__CMAKE_INJECTED_PROJECT_COMMAND__");
              if (bVar2) {
                version.field_2._M_local_buf[10] = '\x01';
                goto LAB_00444dac;
              }
            }
            if (i._4_4_ == 3) {
              i._4_4_ = 2;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_1f8);
              std::__cxx11::string::operator=
                        ((string *)(description.field_2._M_local_buf + 8),(string *)pvVar5);
              InitialPass::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffe18);
            }
            else if (i._4_4_ == 0) {
              i._4_4_ = 2;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_1f8);
              std::__cxx11::string::operator=
                        ((string *)(homepage.field_2._M_local_buf + 8),(string *)pvVar5);
              InitialPass::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffe18);
            }
            else if (i._4_4_ == 1) {
              i._4_4_ = 2;
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_1f8);
              std::__cxx11::string::operator=
                        ((string *)
                         &languages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar5);
              InitialPass::anon_class_8_1_0e9793f7::operator()(&stack0xfffffffffffffe18);
            }
            else {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_7_local,local_1f8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&missedValueReporter._M_invoker,pvVar5);
            }
          }
        }
      }
    }
LAB_00444dac:
  }
  bVar2 = std::function::operator_cast_to_bool((function *)&resetReporter);
  if (bVar2) {
    std::function<void_()>::operator()((function<void_()> *)&resetReporter);
  }
  if (((((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
       ((version.field_2._M_local_buf[0xc] & 1U) == 0)) &&
      ((version.field_2._M_local_buf[0xb] & 1U) == 0)) ||
     (((version.field_2._M_local_buf[0xd] & 1U) != 0 ||
      (bVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&missedValueReporter._M_invoker), bVar2)))) {
    if (((version.field_2._M_local_buf[0xd] & 1U) != 0) &&
       (bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&missedValueReporter._M_invoker), bVar2)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &missedValueReporter._M_invoker,(char (*) [5])0x8afec9);
    }
    local_338 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0048,false);
    if ((version.field_2._M_local_buf[0xe] & 1U) == 0) {
      if (local_338 != OLD) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_750);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                   (char (*) [16])0x86a673);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                   (char (*) [22])0x86a689);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                   (char (*) [22])0x86a6a5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                   (char (*) [22])0x86a6c1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                   (char (*) [22])0x86a6dd);
        std::operator+(&local_770,p,"_VERSION");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_750,&local_770);
        std::__cxx11::string::~string((string *)&local_770);
        std::operator+(&local_790,p,"_VERSION_MAJOR");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_750,&local_790);
        std::__cxx11::string::~string((string *)&local_790);
        std::operator+(&local_7b0,p,"_VERSION_MINOR");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_750,&local_7b0);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::operator+(&local_7d0,p,"_VERSION_PATCH");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_750,&local_7d0);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vw.field_2 + 8),p,"_VERSION_TWEAK");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_750,(value_type *)((long)&vw.field_2 + 8));
        std::__cxx11::string::~string((string *)(vw.field_2._M_local_buf + 8));
        bVar2 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
        if (bVar2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_750,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
        }
        std::__cxx11::string::string((string *)&__range3);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_750);
        i_2 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_750);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&i_2), bVar2) {
          name = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
          pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
          if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
            if (local_338 == WARN) {
              if ((version.field_2._M_local_buf[10] & 1U) == 0) {
                std::__cxx11::string::operator+=((string *)&__range3,"\n  ");
                std::__cxx11::string::operator+=((string *)&__range3,(string *)name);
              }
            }
            else {
              cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,"");
            }
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b0);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_9d0,(cmPolicies *)0x30,id);
          poVar8 = std::operator<<((ostream *)local_9b0,(string *)&local_9d0);
          poVar8 = std::operator<<(poVar8,"\nThe following variable(s) would be set to empty:");
          std::operator<<(poVar8,(string *)&__range3);
          std::__cxx11::string::~string((string *)&local_9d0);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_9f0);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b0);
        }
        std::__cxx11::string::~string((string *)&__range3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_750);
      }
LAB_00445e8b:
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,"PROJECT_DESCRIPTION",&local_a11);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_a10,pcVar3);
      std::__cxx11::string::~string((string *)&local_a10);
      std::allocator<char>::~allocator(&local_a11);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::operator+(&local_a38,p,"_DESCRIPTION");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_a38,pcVar3);
      std::__cxx11::string::~string((string *)&local_a38);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_DESCRIPTION",pcVar3);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a58,"PROJECT_HOMEPAGE_URL",&local_a59);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,&local_a58,pcVar3);
      std::__cxx11::string::~string((string *)&local_a58);
      std::allocator<char>::~allocator(&local_a59);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&extraInclude.field_2 + 8),p,"_HOMEPAGE_URL");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,(string *)((long)&extraInclude.field_2 + 8),pcVar3);
      std::__cxx11::string::~string((string *)(extraInclude.field_2._M_local_buf + 8));
      pcVar3 = (char *)std::__cxx11::string::c_str();
      TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_HOMEPAGE_URL",pcVar3);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&missedValueReporter._M_invoker);
      if (bVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &missedValueReporter._M_invoker,(char (*) [2])0x845288);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[4]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &missedValueReporter._M_invoker,(char (*) [4])0x851c4b);
      }
      cmMakefile::EnableLanguage
                ((this->super_cmCommand).Makefile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&missedValueReporter._M_invoker,false);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include,
                     "CMAKE_PROJECT_",p);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&include,
                     "_INCLUDE");
      std::__cxx11::string::~string((string *)&include);
      pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,(string *)local_aa0);
      pcStack_ac8 = pcVar3;
      if (pcVar3 == (char *)0x0) {
LAB_004463e2:
        this_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
      }
      else {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_af0,pcVar3,(allocator<char> *)(m.field_2._M_local_buf + 0xf));
        bVar2 = cmMakefile::ReadDependentFile(pcVar1,&local_af0,true);
        std::__cxx11::string::~string((string *)&local_af0);
        std::allocator<char>::~allocator((allocator<char> *)(m.field_2._M_local_buf + 0xf));
        local_ac9 = bVar2;
        if ((bVar2) || (bVar2 = cmSystemTools::GetFatalErrorOccured(), bVar2)) goto LAB_004463e2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b18,"could not find file:\n  ",&local_b19);
        std::allocator<char>::~allocator(&local_b19);
        std::__cxx11::string::operator+=((string *)local_b18,pcStack_ac8);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_b18);
        this_local._7_1_ = 0;
        msg.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_b18);
      }
      std::__cxx11::string::~string((string *)local_aa0);
    }
    else if ((local_338 == OLD) || (local_338 == WARN)) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"VERSION not allowed unless CMP0048 is set to NEW",
                 (allocator<char> *)&vx.field_0xcf);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator((allocator<char> *)&vx.field_0xcf);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 1;
      msg.field_2._8_4_ = 1;
    }
    else {
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&e.field_2 + 8),
                 "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&e.field_2 + 8),
                         (string *)((long)&description.field_2 + 8));
      if (bVar2) {
        std::__cxx11::string::string((string *)&sep);
        vb[3]._56_8_ = (long)"PK\x01\x02" + 4;
        memset(&i_1,0,0x10);
        uVar6 = std::__cxx11::string::c_str();
        vv.field_2._12_4_ = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&i_1,&vc,v,v + 1);
        for (vv.field_2._8_4_ = 0; (int)vv.field_2._8_4_ < 4;
            vv.field_2._8_4_ = vv.field_2._8_4_ + 1) {
          if ((int)vv.field_2._8_4_ < (int)vv.field_2._12_4_) {
            sprintf(vb[(long)(int)vv.field_2._8_4_ + -1] + 0x38,"%u",
                    (ulong)(uint)(&i_1)[(int)vv.field_2._8_4_]);
            std::__cxx11::string::operator+=((string *)&sep,(char *)vb[3]._56_8_);
            std::__cxx11::string::operator+=
                      ((string *)&sep,vb[(long)(int)vv.field_2._8_4_ + -1] + 0x38);
            vb[3]._56_8_ = (long)"@cd ." + 4;
          }
          else {
            vb[(long)(int)vv.field_2._8_4_ + -1][0x38] = '\0';
          }
        }
        std::__cxx11::string::string((string *)local_5d0);
        std::operator+(&local_5f0,p,"_VERSION");
        std::__cxx11::string::operator=((string *)local_5d0,(string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_5f0);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_610,"PROJECT_VERSION",&local_611);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,&local_610,pcVar3);
        std::__cxx11::string::~string((string *)&local_610);
        std::allocator<char>::~allocator(&local_611);
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_5d0,pcVar3);
        std::operator+(&local_638,p,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)local_5d0,(string *)&local_638);
        std::__cxx11::string::~string((string *)&local_638);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_658,"PROJECT_VERSION_MAJOR",&local_659);
        cmMakefile::AddDefinition(pcVar1,&local_658,(char *)(v + 2));
        std::__cxx11::string::~string((string *)&local_658);
        std::allocator<char>::~allocator(&local_659);
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,(string *)local_5d0,(char *)(v + 2));
        std::operator+(&local_680,p,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)local_5d0,(string *)&local_680);
        std::__cxx11::string::~string((string *)&local_680);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6a0,"PROJECT_VERSION_MINOR",&local_6a1);
        cmMakefile::AddDefinition(pcVar1,&local_6a0,vb[0] + 0x38);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::allocator<char>::~allocator(&local_6a1);
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_5d0,vb[0] + 0x38)
        ;
        std::operator+(&local_6c8,p,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)local_5d0,(string *)&local_6c8);
        std::__cxx11::string::~string((string *)&local_6c8);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e8,"PROJECT_VERSION_PATCH",&local_6e9);
        cmMakefile::AddDefinition(pcVar1,&local_6e8,vb[1] + 0x38);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_5d0,vb[1] + 0x38)
        ;
        std::operator+(&local_710,p,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)local_5d0,(string *)&local_710);
        std::__cxx11::string::~string((string *)&local_710);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_730,"PROJECT_VERSION_TWEAK",
                   (allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmMakefile::AddDefinition(pcVar1,&local_730,vb[2] + 0x38);
        std::__cxx11::string::~string((string *)&local_730);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&vv_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_5d0,vb[2] + 0x38)
        ;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION",pcVar3);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MAJOR",(char *)(v + 2));
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_MINOR",vb[0] + 0x38);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_PATCH",vb[1] + 0x38);
        TopLevelCMakeVarCondSet(this,"CMAKE_PROJECT_VERSION_TWEAK",vb[2] + 0x38);
        std::__cxx11::string::~string((string *)local_5d0);
        std::__cxx11::string::~string((string *)&sep);
        msg.field_2._8_4_ = 0;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"VERSION \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&description.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_450,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&vs.field_2 + 8),"\" format invalid.");
        std::__cxx11::string::~string((string *)(vs.field_2._M_local_buf + 8));
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,FATAL_ERROR,(string *)local_450);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 1;
        msg.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_450);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e.field_2 + 8));
      if (msg.field_2._8_4_ == 0) goto LAB_00445e8b;
    }
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmp0048,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,&local_331);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&cmp0048);
    std::__cxx11::string::~string((string *)&cmp0048);
    std::allocator<char>::~allocator(&local_331);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 1;
    msg.field_2._8_4_ = 1;
  }
LAB_0044640c:
  std::function<void_()>::~function((function<void_()> *)&resetReporter);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&missedValueReporter._M_invoker);
  std::__cxx11::string::~string
            ((string *)
             &languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(homepage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(srcdir.field_2._M_local_buf + 8));
LAB_004464b2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmProjectCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  std::string const& projectName = args[0];

  this->Makefile->SetProjectName(projectName);

  std::string bindir = projectName;
  bindir += "_BINARY_DIR";
  std::string srcdir = projectName;
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);
  this->Makefile->AddCacheDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str());
  this->Makefile->AddDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str());

  this->Makefile->AddDefinition("PROJECT_NAME", projectName.c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME") ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", projectName.c_str());
    this->Makefile->AddCacheDefinition(
      "CMAKE_PROJECT_NAME", projectName.c_str(), "Value Computed by CMake",
      cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg =
          "the following parameters must be specified after LANGUAGES "
          "keyword: ";
        msg += cmJoin(languages, ", ");
        msg += '.';
        this->Makefile->IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
      "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    cmsys::RegularExpression vx(
      "^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
    if (!vx.find(version)) {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = { 0, 0, 0, 0 };
    int vc =
      sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1], &v[2], &v[3]);
    for (int i = 0; i < 4; ++i) {
      if (i < vc) {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
      } else {
        vb[i][0] = 0;
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = projectName + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = projectName + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = projectName + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = projectName + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION", vs.c_str());
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MAJOR", vb[0]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MINOR", vb[1]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_PATCH", vb[2]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_TWEAK", vb[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.emplace_back("PROJECT_VERSION");
    vv.emplace_back("PROJECT_VERSION_MAJOR");
    vv.emplace_back("PROJECT_VERSION_MINOR");
    vv.emplace_back("PROJECT_VERSION_PATCH");
    vv.emplace_back("PROJECT_VERSION_TWEAK");
    vv.push_back(projectName + "_VERSION");
    vv.push_back(projectName + "_VERSION_MAJOR");
    vv.push_back(projectName + "_VERSION_MINOR");
    vv.push_back(projectName + "_VERSION_PATCH");
    vv.push_back(projectName + "_VERSION_TWEAK");
    if (this->Makefile->IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      const char* v = this->Makefile->GetDefinition(i);
      if (v && *v) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          this->Makefile->AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }

  this->Makefile->AddDefinition("PROJECT_DESCRIPTION", description.c_str());
  this->Makefile->AddDefinition(projectName + "_DESCRIPTION",
                                description.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_DESCRIPTION", description.c_str());

  this->Makefile->AddDefinition("PROJECT_HOMEPAGE_URL", homepage.c_str());
  this->Makefile->AddDefinition(projectName + "_HOMEPAGE_URL",
                                homepage.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_HOMEPAGE_URL", homepage.c_str());

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages.emplace_back("C");
    languages.emplace_back("CXX");
  }
  this->Makefile->EnableLanguage(languages, false);
  std::string extraInclude = "CMAKE_PROJECT_" + projectName + "_INCLUDE";
  const char* include = this->Makefile->GetDefinition(extraInclude);
  if (include) {
    bool readit = this->Makefile->ReadDependentFile(include);
    if (!readit && !cmSystemTools::GetFatalErrorOccured()) {
      std::string m = "could not find file:\n"
                      "  ";
      m += include;
      this->SetError(m);
      return false;
    }
  }
  return true;
}